

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O0

bool __thiscall S2ShapeIndex::Iterator::Locate(Iterator *this,S2Point *target)

{
  bool bVar1;
  S2Point *target_local;
  Iterator *this_local;
  
  bVar1 = IteratorBase::LocateImpl<S2ShapeIndex::Iterator>(target,this);
  return bVar1;
}

Assistant:

bool Locate(const S2Point& target) {
      return IteratorBase::LocateImpl(target, this);
    }